

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

KOption getoption(Header *h,char **fmt,int *size)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  int opt;
  int *size_local;
  char **fmt_local;
  Header *h_local;
  
  pcVar1 = *fmt;
  *fmt = pcVar1 + 1;
  uVar2 = (uint)*pcVar1;
  *size = 0;
  switch(uVar2) {
  case 0x20:
    goto LAB_0012a510;
  case 0x21:
    iVar3 = getnumlimit(h,fmt,8);
    h->maxalign = iVar3;
    goto LAB_0012a510;
  default:
    luaL_error(h->L,"invalid format option \'%c\'",(ulong)uVar2);
    goto LAB_0012a510;
  case 0x3c:
    h->islittle = 1;
    goto LAB_0012a510;
  case 0x3d:
    h->islittle = 1;
    goto LAB_0012a510;
  case 0x3e:
    h->islittle = 0;
LAB_0012a510:
    h_local._4_4_ = Knop;
    break;
  case 0x42:
    *size = 1;
    h_local._4_4_ = Kuint;
    break;
  case 0x48:
    *size = 2;
    h_local._4_4_ = Kuint;
    break;
  case 0x49:
    iVar3 = getnumlimit(h,fmt,4);
    *size = iVar3;
    h_local._4_4_ = Kuint;
    break;
  case 0x4a:
    *size = 8;
    h_local._4_4_ = Kuint;
    break;
  case 0x4c:
    *size = 8;
    h_local._4_4_ = Kuint;
    break;
  case 0x54:
    *size = 8;
    h_local._4_4_ = Kuint;
    break;
  case 0x58:
    h_local._4_4_ = Kpaddalign;
    break;
  case 0x62:
    *size = 1;
    h_local._4_4_ = Kint;
    break;
  case 99:
    iVar3 = getnum(fmt,-1);
    *size = iVar3;
    if (*size == -1) {
      luaL_error(h->L,"missing size for format option \'c\'");
    }
    h_local._4_4_ = Kchar;
    break;
  case 100:
    *size = 8;
    h_local._4_4_ = Kfloat;
    break;
  case 0x66:
    *size = 4;
    h_local._4_4_ = Kfloat;
    break;
  case 0x68:
    *size = 2;
    h_local._4_4_ = Kint;
    break;
  case 0x69:
    iVar3 = getnumlimit(h,fmt,4);
    *size = iVar3;
    h_local._4_4_ = Kint;
    break;
  case 0x6a:
    *size = 8;
    h_local._4_4_ = Kint;
    break;
  case 0x6c:
    *size = 8;
    h_local._4_4_ = Kint;
    break;
  case 0x6e:
    *size = 8;
    h_local._4_4_ = Kfloat;
    break;
  case 0x73:
    iVar3 = getnumlimit(h,fmt,8);
    *size = iVar3;
    h_local._4_4_ = Kstring;
    break;
  case 0x78:
    *size = 1;
    h_local._4_4_ = Kpadding;
    break;
  case 0x7a:
    h_local._4_4_ = Kzstr;
  }
  return h_local._4_4_;
}

Assistant:

static KOption getoption (Header *h, const char **fmt, int *size) {
  int opt = *((*fmt)++);
  *size = 0;  /* default */
  switch (opt) {
    case 'b': *size = sizeof(char); return Kint;
    case 'B': *size = sizeof(char); return Kuint;
    case 'h': *size = sizeof(short); return Kint;
    case 'H': *size = sizeof(short); return Kuint;
    case 'l': *size = sizeof(long); return Kint;
    case 'L': *size = sizeof(long); return Kuint;
    case 'j': *size = sizeof(lua_Integer); return Kint;
    case 'J': *size = sizeof(lua_Integer); return Kuint;
    case 'T': *size = sizeof(size_t); return Kuint;
    case 'f': *size = sizeof(float); return Kfloat;
    case 'd': *size = sizeof(double); return Kfloat;
    case 'n': *size = sizeof(lua_Number); return Kfloat;
    case 'i': *size = getnumlimit(h, fmt, sizeof(int)); return Kint;
    case 'I': *size = getnumlimit(h, fmt, sizeof(int)); return Kuint;
    case 's': *size = getnumlimit(h, fmt, sizeof(size_t)); return Kstring;
    case 'c':
      *size = getnum(fmt, -1);
      if (*size == -1)
        luaL_error(h->L, "missing size for format option 'c'");
      return Kchar;
    case 'z': return Kzstr;
    case 'x': *size = 1; return Kpadding;
    case 'X': return Kpaddalign;
    case ' ': break;
    case '<': h->islittle = 1; break;
    case '>': h->islittle = 0; break;
    case '=': h->islittle = nativeendian.little; break;
    case '!': h->maxalign = getnumlimit(h, fmt, MAXALIGN); break;
    default: luaL_error(h->L, "invalid format option '%c'", opt);
  }
  return Knop;
}